

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

void __thiscall r_exec::_GMonitor::invalidate_sim_outcomes(_GMonitor *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->sim_failures).mandatory_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      (SimOutcomes *)p_Var1 != &this->sim_failures; p_Var1 = p_Var1->_M_next) {
    Sim::invalidate(*(Sim **)((long)(p_Var1 + 1) + 8));
  }
  for (p_Var1 = (this->sim_failures).optional_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->sim_failures).optional_solutions;
      p_Var1 = p_Var1->_M_next) {
    Sim::invalidate((Sim *)p_Var1[1]._M_prev);
  }
  for (p_Var1 = (this->sim_successes).mandatory_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      (SimOutcomes *)p_Var1 != &this->sim_successes; p_Var1 = p_Var1->_M_next) {
    Sim::invalidate(*(Sim **)((long)(p_Var1 + 1) + 8));
  }
  for (p_Var1 = (this->sim_successes).optional_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->sim_successes).optional_solutions;
      p_Var1 = p_Var1->_M_next) {
    Sim::invalidate((Sim *)p_Var1[1]._M_prev);
  }
  return;
}

Assistant:

void _GMonitor::invalidate_sim_outcomes()
{
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }
}